

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O3

Chunk * __thiscall riffcpp::Chunk::operator=(Chunk *this,Chunk *lhs)

{
  impl *piVar1;
  impl *piVar2;
  __mbstate_t _Var3;
  
  piVar1 = lhs->pimpl;
  piVar2 = this->pimpl;
  (piVar2->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (piVar1->m_buf).
            super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(piVar2->m_buf).
              super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(piVar1->m_buf).
              super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  piVar1 = lhs->pimpl;
  piVar2 = this->pimpl;
  (piVar2->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (piVar1->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(piVar2->m_stream).
              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(piVar1->m_stream).
              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  piVar1 = this->pimpl;
  _Var3 = (lhs->pimpl->m_pos)._M_state;
  (piVar1->m_pos)._M_off = (lhs->pimpl->m_pos)._M_off;
  (piVar1->m_pos)._M_state = _Var3;
  piVar1 = this->pimpl;
  _Var3 = (lhs->pimpl->m_limit)._M_state;
  (piVar1->m_limit)._M_off = (lhs->pimpl->m_limit)._M_off;
  (piVar1->m_limit)._M_state = _Var3;
  *(undefined4 *)(this->pimpl->m_id)._M_elems = *(undefined4 *)(lhs->pimpl->m_id)._M_elems;
  this->pimpl->m_size = lhs->pimpl->m_size;
  return this;
}

Assistant:

riffcpp::Chunk &riffcpp::Chunk::operator=(const riffcpp::Chunk &lhs) {
  pimpl->m_buf = lhs.pimpl->m_buf;
  pimpl->m_stream = lhs.pimpl->m_stream;
  pimpl->m_pos = lhs.pimpl->m_pos;
  pimpl->m_limit = lhs.pimpl->m_limit;
  pimpl->m_id = lhs.pimpl->m_id;
  pimpl->m_size = lhs.pimpl->m_size;
  return *this;
}